

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O0

CBan<CNetRange> * __thiscall
CNetBan::CBanPool<CNetRange,_16>::Add
          (CBanPool<CNetRange,_16> *this,CDataType *pData,CBanInfo *pInfo,CNetHash *pNetHash)

{
  CNetHash *in_RCX;
  int *in_RDX;
  void *in_RSI;
  long in_RDI;
  CBan<CNetRange> *p;
  CBan<CNetRange> *pBan;
  CBan<CNetRange> *local_38;
  CBan<CNetRange> *local_8;
  
  if (*(long *)(in_RDI + 0x30000) == 0) {
    local_8 = (CBan<CNetRange> *)0x0;
  }
  else {
    local_8 = *(CBan<CNetRange> **)(in_RDI + 0x30000);
    memcpy(local_8,in_RSI,0x30);
    memcpy(&local_8->m_Info,in_RDX,0x48);
    local_8->m_NetHash = *in_RCX;
    if (local_8->m_pNext != (CBan<CNetRange> *)0x0) {
      local_8->m_pNext->m_pPrev = local_8->m_pPrev;
    }
    if (local_8->m_pPrev == (CBan<CNetRange> *)0x0) {
      *(CBan<CNetRange> **)(in_RDI + 0x30000) = local_8->m_pNext;
    }
    else {
      local_8->m_pPrev->m_pNext = local_8->m_pNext;
    }
    if (*(long *)(in_RDI + (long)in_RCX->m_HashIndex * 0x800 + (long)in_RCX->m_Hash * 8) != 0) {
      *(CBan<CNetRange> **)
       (*(long *)(in_RDI + (long)in_RCX->m_HashIndex * 0x800 + (long)in_RCX->m_Hash * 8) + 0x88) =
           local_8;
    }
    local_8->m_pHashPrev = (CBan<CNetRange> *)0x0;
    local_8->m_pHashNext =
         *(CBan<CNetRange> **)
          (in_RDI + (long)in_RCX->m_HashIndex * 0x800 + (long)in_RCX->m_Hash * 8);
    *(CBan<CNetRange> **)(in_RDI + (long)in_RCX->m_HashIndex * 0x800 + (long)in_RCX->m_Hash * 8) =
         local_8;
    if (*(long *)(in_RDI + 0x30008) == 0) {
      *(CBan<CNetRange> **)(in_RDI + 0x30008) = local_8;
      local_8->m_pPrev = (CBan<CNetRange> *)0x0;
      local_8->m_pNext = (CBan<CNetRange> *)0x0;
    }
    else {
      for (local_38 = *(CBan<CNetRange> **)(in_RDI + 0x30008);
          ((local_38->m_Info).m_Expires != -1 &&
          ((*in_RDX == -1 || ((local_38->m_Info).m_Expires < *in_RDX))));
          local_38 = local_38->m_pNext) {
        if (local_38->m_pNext == (CBan<CNetRange> *)0x0) {
          local_38->m_pNext = local_8;
          local_8->m_pPrev = local_38;
          local_8->m_pNext = (CBan<CNetRange> *)0x0;
          goto LAB_001542c4;
        }
      }
      local_8->m_pNext = local_38;
      local_8->m_pPrev = local_38->m_pPrev;
      if (local_38->m_pPrev == (CBan<CNetRange> *)0x0) {
        *(CBan<CNetRange> **)(in_RDI + 0x30008) = local_8;
      }
      else {
        local_38->m_pPrev->m_pNext = local_8;
      }
      local_38->m_pPrev = local_8;
    }
LAB_001542c4:
    *(int *)(in_RDI + 0x30010) = *(int *)(in_RDI + 0x30010) + 1;
  }
  return local_8;
}

Assistant:

typename CNetBan::CBan<T> *CNetBan::CBanPool<T, HashCount>::Add(const T *pData, const CBanInfo *pInfo,  const CNetHash *pNetHash)
{
	if(!m_pFirstFree)
		return 0;

	// create new ban
	CBan<T> *pBan = m_pFirstFree;
	pBan->m_Data = *pData;
	pBan->m_Info = *pInfo;
	pBan->m_NetHash = *pNetHash;
	if(pBan->m_pNext)
		pBan->m_pNext->m_pPrev = pBan->m_pPrev;
	if(pBan->m_pPrev)
		pBan->m_pPrev->m_pNext = pBan->m_pNext;
	else
		m_pFirstFree = pBan->m_pNext;

	// add it to the hash list
	if(m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash])
		m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash]->m_pHashPrev = pBan;
	pBan->m_pHashPrev = 0;
	pBan->m_pHashNext = m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash];
	m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash] = pBan;

	// insert it into the used list
	if(m_pFirstUsed)
	{
		for(CBan<T> *p = m_pFirstUsed; ; p = p->m_pNext)
		{
			if(p->m_Info.m_Expires == CBanInfo::EXPIRES_NEVER || (pInfo->m_Expires != CBanInfo::EXPIRES_NEVER && pInfo->m_Expires <= p->m_Info.m_Expires))
			{
				// insert before
				pBan->m_pNext = p;
				pBan->m_pPrev = p->m_pPrev;
				if(p->m_pPrev)
					p->m_pPrev->m_pNext = pBan;
				else
					m_pFirstUsed = pBan;
				p->m_pPrev = pBan;
				break;
			}

			if(!p->m_pNext)
			{
				// last entry
				p->m_pNext = pBan;
				pBan->m_pPrev = p;
				pBan->m_pNext = 0;
				break;
			}
		}
	}
	else
	{
		m_pFirstUsed = pBan;
		pBan->m_pNext = pBan->m_pPrev = 0;
	}

	// update ban count
	++m_CountUsed;

	return pBan;
}